

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

void UnifiedRegex::RegexPattern::TraceTestCache
               (bool cacheHit,JavascriptString *input,JavascriptString *cachedValue,bool disabled)

{
  char16 *pcVar1;
  char16_t *form;
  
  if (DAT_01459498 != '\x01') {
    return;
  }
  if (disabled) {
    form = L"Regexp Test Cache Disabled.\n";
  }
  else if (cacheHit) {
    form = L"Regexp Test Cache Hit.\n";
  }
  else {
    Output::Print(L"Regexp Test Cache Miss. ");
    if (cachedValue != (JavascriptString *)0x0) {
      pcVar1 = Js::JavascriptString::GetString(cachedValue);
      Output::Print(L"Input: (%p); Cached String: (%p) \'%s\'\n",input,cachedValue,pcVar1);
      return;
    }
    form = L"Cache was empty\n";
  }
  Output::Print(form);
  return;
}

Assistant:

void RegexPattern::TraceTestCache(bool cacheHit, Js::JavascriptString* input, Js::JavascriptString* cachedValue, bool disabled)
    {
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            if (disabled)
            {
                Output::Print(_u("Regexp Test Cache Disabled.\n"));
            }
            else if (cacheHit)
            {
                Output::Print(_u("Regexp Test Cache Hit.\n"));
            }
            else
            {
                Output::Print(_u("Regexp Test Cache Miss. "));
                if (cachedValue != nullptr)
                {
                    Output::Print(_u("Input: (%p); Cached String: (%p) '%s'\n"), input, cachedValue, cachedValue->GetString());
                }
                else
                {
                    Output::Print(_u("Cache was empty\n"));
                }
            }
        }
    }